

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O1

UBool __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::following
          (DictionaryCache *this,int32_t fromPos,int32_t *result,int32_t *statusIndex)

{
  int iVar1;
  int iVar2;
  int32_t *piVar3;
  uint uVar4;
  long lVar5;
  int32_t iVar6;
  long lVar7;
  
  if ((fromPos < this->fLimit) && (this->fStart <= fromPos)) {
    iVar1 = this->fPositionInCache;
    if ((-1 < (long)iVar1) && (iVar2 = (this->fBreaks).count, iVar1 < iVar2)) {
      if (iVar2 < 1) {
        iVar6 = 0;
      }
      else {
        iVar6 = (this->fBreaks).elements[iVar1];
      }
      if (iVar6 == fromPos) {
        uVar4 = iVar1 + 1;
        this->fPositionInCache = uVar4;
        if ((int)uVar4 < iVar2) {
          if (iVar2 < 1) {
            iVar6 = 0;
          }
          else {
            iVar6 = (this->fBreaks).elements[uVar4];
          }
          *result = iVar6;
LAB_002af7da:
          *statusIndex = this->fOtherRuleStatusIndex;
          return '\x01';
        }
        goto LAB_002af7c7;
      }
    }
    lVar5 = (long)(this->fBreaks).count;
    this->fPositionInCache = 0;
    if (0 < lVar5) {
      piVar3 = (this->fBreaks).elements;
      lVar7 = 0;
      do {
        iVar1 = piVar3[lVar7];
        if (fromPos < iVar1) {
          *result = iVar1;
          goto LAB_002af7da;
        }
        lVar7 = lVar7 + 1;
        this->fPositionInCache = (int32_t)lVar7;
      } while (lVar5 != lVar7);
    }
  }
LAB_002af7c7:
  this->fPositionInCache = -1;
  return '\0';
}

Assistant:

UBool RuleBasedBreakIterator::DictionaryCache::following(int32_t fromPos, int32_t *result, int32_t *statusIndex) {
    if (fromPos >= fLimit || fromPos < fStart) {
        fPositionInCache = -1;
        return FALSE;
    }

    // Sequential iteration, move from previous boundary to the following

    int32_t r = 0;
    if (fPositionInCache >= 0 && fPositionInCache < fBreaks.size() && fBreaks.elementAti(fPositionInCache) == fromPos) {
        ++fPositionInCache;
        if (fPositionInCache >= fBreaks.size()) {
            fPositionInCache = -1;
            return FALSE;
        }
        r = fBreaks.elementAti(fPositionInCache);
        U_ASSERT(r > fromPos);
        *result = r;
        *statusIndex = fOtherRuleStatusIndex;
        return TRUE;
    }

    // Random indexing. Linear search for the boundary following the given position.

    for (fPositionInCache = 0; fPositionInCache < fBreaks.size(); ++fPositionInCache) {
        r= fBreaks.elementAti(fPositionInCache);
        if (r > fromPos) {
            *result = r;
            *statusIndex = fOtherRuleStatusIndex;
            return TRUE;
        }
    }
    U_ASSERT(FALSE);
    fPositionInCache = -1;
    return FALSE;
}